

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O0

FILE * ly_in_file(ly_in *in,FILE *f)

{
  int iVar1;
  FILE *prev_f;
  FILE *f_local;
  ly_in *in_local;
  
  if (in == (ly_in *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in","ly_in_file");
    in_local = (ly_in *)0x0;
  }
  else if (in->type == LY_IN_FILE) {
    in_local = (ly_in *)(in->method).f;
    if (f != (FILE *)0x0) {
      in->type = LY_IN_FD;
      iVar1 = fileno((FILE *)in_local);
      (in->method).fd = iVar1;
      iVar1 = fileno((FILE *)f);
      iVar1 = ly_in_fd(in,iVar1);
      if (iVar1 == -1) {
        in->type = LY_IN_FILE;
        (in->method).f = (FILE *)in_local;
        in_local = (ly_in *)0x0;
      }
      else {
        in->type = LY_IN_FILE;
        (in->method).f = f;
      }
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","in->type == LY_IN_FILE",
           "ly_in_file");
    in_local = (ly_in *)0x0;
  }
  return (FILE *)in_local;
}

Assistant:

LIBYANG_API_DEF FILE *
ly_in_file(struct ly_in *in, FILE *f)
{
    FILE *prev_f;

    LY_CHECK_ARG_RET(NULL, in, in->type == LY_IN_FILE, NULL);

    prev_f = in->method.f;

    if (f) {
        /* convert LY_IN_FILE handler into LY_IN_FD to be able to update it via ly_in_fd() */
        in->type = LY_IN_FD;
        in->method.fd = fileno(prev_f);
        if (ly_in_fd(in, fileno(f)) == -1) {
            in->type = LY_IN_FILE;
            in->method.f = prev_f;
            return NULL;
        }

        /* if success, convert the result back */
        in->type = LY_IN_FILE;
        in->method.f = f;
    }

    return prev_f;
}